

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Opcodes.cpp
# Opt level: O2

void Opcodes::run(SFLAG_Register *sfr,GEN_Register *gr,RAM *mem,
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *cmd)

{
  uint8_t uVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *cmd_00;
  RAM *mem_00;
  string *sfr_00;
  string sStack_48;
  
  sfr_00 = &sStack_48;
  cmd_00 = cmd;
  std::__cxx11::string::string
            ((string *)&sStack_48,
             (string *)
             (cmd->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start);
  uVar1 = getHexOpcode(&sStack_48);
  std::__cxx11::string::~string((string *)&sStack_48);
  if (uVar1 == 0x80) {
    ADD((SFLAG_Register *)sfr_00,gr,mem_00,cmd);
  }
  else if (uVar1 == '7') {
    AAA(sfr,gr,mem_00,cmd_00);
  }
  return;
}

Assistant:

void Opcodes::run(SFLAG_Register &sfr, GEN_Register &gr, RAM &mem, std::vector<std::string> &cmd) {
    // Get the numeric opcode.
    uint8_t opcodeNumber = Opcodes::getHexOpcode(cmd[0]);
    // Check to see if the opcode is valid.
    if (opcodeNumber == 0x0) {
        // This opcode is not valid. Return for now.
        // TODO: Throw a triple-step error.
        return;
    }
    // Opcode is valid, compare it against the list of added opcode functions.
    switch (opcodeNumber) {
        case 0x37:
            AAA(sfr, gr, mem, cmd);
            break;
        case 0x80:
            ADD(sfr, gr, mem, cmd);
            break;
        default:
            break;
    }
}